

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

llm_graph_input_attn_no_cache * __thiscall
llm_graph_context::build_attn_inp_no_cache(llm_graph_context *this)

{
  undefined8 uVar1;
  ggml_tensor *pgVar2;
  pointer plVar3;
  pointer this_00;
  llm_graph_input_attn_no_cache *plVar4;
  long in_RDI;
  __single_object inp;
  llm_graph_input_ptr *in_stack_ffffffffffffff78;
  unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
  *__u;
  llama_cparams *in_stack_ffffffffffffffa0;
  llama_hparams *in_stack_ffffffffffffffa8;
  unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
  local_10 [2];
  
  std::make_unique<llm_graph_input_attn_no_cache,llama_hparams_const&,llama_cparams_const&>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pgVar2 = (ggml_tensor *)
           ggml_new_tensor_2d(*(undefined8 *)(in_RDI + 0xc0),0,(long)*(int *)(in_RDI + 0xa8),
                              (long)(int)(*(int *)(in_RDI + 0xa8) + 0x3fU & 0xffffffc0));
  plVar3 = std::
           unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
           ::operator->((unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
                         *)0x435ba9);
  plVar3->kq_mask = pgVar2;
  plVar3 = std::
           unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
           ::operator->((unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
                         *)0x435bbc);
  ggml_set_input(plVar3->kq_mask);
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x3b) & 1) == 0) {
    plVar3 = std::
             unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
             ::operator->((unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
                           *)0x435c21);
    pgVar2 = plVar3->kq_mask;
  }
  else {
    uVar1 = *(undefined8 *)(in_RDI + 0xc0);
    plVar3 = std::
             unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
             ::operator->((unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
                           *)0x435bf1);
    pgVar2 = (ggml_tensor *)ggml_cast(uVar1,plVar3->kq_mask,1);
  }
  __u = local_10;
  plVar3 = std::
           unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
           ::operator->((unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
                         *)0x435c43);
  plVar3->kq_mask_cnv = pgVar2;
  this_00 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x435c5d);
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_attn_no_cache,std::default_delete<llm_graph_input_attn_no_cache>,void>
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)this_00,__u);
  plVar4 = (llm_graph_input_attn_no_cache *)
           llm_graph_result::add_input((llm_graph_result *)pgVar2,in_stack_ffffffffffffff78);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)pgVar2);
  std::
  unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>::
  ~unique_ptr((unique_ptr<llm_graph_input_attn_no_cache,_std::default_delete<llm_graph_input_attn_no_cache>_>
               *)pgVar2);
  return plVar4;
}

Assistant:

llm_graph_input_attn_no_cache * llm_graph_context::build_attn_inp_no_cache() const {
    auto inp = std::make_unique<llm_graph_input_attn_no_cache>(hparams, cparams);

    // note: there is no KV cache, so the number of KV values is equal to the number of tokens in the batch
    inp->kq_mask = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_tokens, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
    //cb(inp_kq_mask, "KQ_mask", -1);
    ggml_set_input(inp->kq_mask);

    inp->kq_mask_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->kq_mask, GGML_TYPE_F16) : inp->kq_mask;

    return (llm_graph_input_attn_no_cache *) res->add_input(std::move(inp));
}